

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcoll.c
# Opt level: O3

int ffpcll(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,char *array
          ,int *status)

{
  int iVar1;
  char *buffer;
  long lVar2;
  long lVar3;
  char cfalse;
  char ctrue;
  LONGLONG elemnum;
  int tcode;
  LONGLONG rowlen;
  LONGLONG startpos;
  LONGLONG repeat;
  long incre;
  int hdutype;
  int maxelem;
  double zero;
  double scale;
  LONGLONG tnull;
  long twidth;
  char snull [20];
  char tform [20];
  char message [81];
  
  ctrue = 'T';
  cfalse = 'F';
  if (0 < *status) {
    return *status;
  }
  iVar1 = ffgcprll(fptr,colnum,firstrow,firstelem,nelem,1,&scale,&zero,tform,&twidth,&tcode,&maxelem
                   ,&startpos,&elemnum,&incre,&repeat,&rowlen,&hdutype,&tnull,snull,status);
  if (iVar1 < 1) {
    if (tcode != 0xe) {
      *status = 0x136;
      return 0x136;
    }
    if (nelem != 0) {
      lVar3 = 0;
      lVar2 = 0;
      while( true ) {
        ffmbyt(fptr,incre * elemnum + rowlen * lVar3 + startpos,1,status);
        buffer = &ctrue;
        if (array[lVar2] == '\0') {
          buffer = &cfalse;
        }
        ffpbyt(fptr,1,buffer,status);
        if (0 < *status) break;
        if (nelem == 1) {
          return *status;
        }
        lVar2 = lVar2 + 1;
        elemnum = elemnum + 1;
        nelem = nelem + -1;
        if (elemnum == repeat) {
          elemnum = 0;
          lVar3 = lVar3 + 1;
        }
      }
      snprintf(message,0x51,"Error writing element %.0f of input array of logicals (ffpcll).",
               (double)(lVar2 + 1));
      ffpmsg(message);
    }
  }
  return *status;
}

Assistant:

int ffpcll( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  colnum,     /* I - number of column to write (1 = 1st col) */
            LONGLONG  firstrow,  /* I - first row to write (1 = 1st row)        */
            LONGLONG  firstelem, /* I - first vector element to write (1 = 1st) */
            LONGLONG  nelem,     /* I - number of values to write               */
            char *array,     /* I - array of values to write                */
            int  *status)    /* IO - error status                           */
/*
  Write an array of logical values to a column in the current FITS HDU.
*/
{
    int tcode, maxelem, hdutype;
    long twidth, incre;
    LONGLONG repeat, startpos, elemnum, wrtptr, rowlen, rownum, remain, next, tnull;
    double scale, zero;
    char tform[20], ctrue = 'T', cfalse = 'F';
    char message[FLEN_ERRMSG];
    char snull[20];   /*  the FITS null value  */

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /*---------------------------------------------------*/
    /*  Check input and get parameters about the column: */
    /*---------------------------------------------------*/
    if (ffgcprll( fptr, colnum, firstrow, firstelem, nelem, 1, &scale, &zero,
        tform, &twidth, &tcode, &maxelem, &startpos,  &elemnum, &incre,
        &repeat, &rowlen, &hdutype, &tnull, snull, status) > 0)
        return(*status);

    if (tcode != TLOGICAL)   
        return(*status = NOT_LOGICAL_COL);

    /*---------------------------------------------------------------------*/
    /*  Now write the logical values one at a time to the FITS column.     */
    /*---------------------------------------------------------------------*/
    remain = nelem;           /* remaining number of values to write  */
    next = 0;                 /* next element in array to be written  */
    rownum = 0;               /* row number, relative to firstrow     */

    while (remain)
    {
      wrtptr = startpos + (rowlen * rownum) + (elemnum * incre);

      ffmbyt(fptr, wrtptr, IGNORE_EOF, status);  /* move to write position */

      if (array[next])
         ffpbyt(fptr, 1, &ctrue, status);
      else
         ffpbyt(fptr, 1, &cfalse, status);

      if (*status > 0)  /* test for error during previous write operation */
      {
        snprintf(message,FLEN_ERRMSG,
           "Error writing element %.0f of input array of logicals (ffpcll).",
            (double) (next+1));
        ffpmsg(message);
        return(*status);
      }

      /*--------------------------------------------*/
      /*  increment the counters for the next loop  */
      /*--------------------------------------------*/
      remain--;
      if (remain)
      {
        next++;
        elemnum++;
        if (elemnum == repeat)  /* completed a row; start on next row */
        {
           elemnum = 0;
           rownum++;
        }
      }

    }  /*  End of main while Loop  */

    return(*status);
}